

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall CMU462::Application::mouse_event(Application *this,int key,int event,uchar mods)

{
  if (event == 0) {
    if (key == 2) {
      this->middleDown = false;
    }
    else if (key == 1) {
      this->rightDown = false;
    }
    else {
      if (key != 0) {
        return;
      }
      this->leftDown = false;
      this->draggingTimeline = false;
      DynamicScene::XFormWidget::updateGeometry(this->scene->elementTransform);
    }
  }
  else {
    if (event != 1) {
      return;
    }
    if (key == 2) {
      this->middleDown = true;
    }
    else {
      if (key != 1) {
        if (key != 0) {
          return;
        }
        mouse_pressed(this,LEFT);
        return;
      }
      this->rightDown = true;
    }
  }
  updateWidgets(this);
  return;
}

Assistant:

void Application::mouse_event(int key, int event, unsigned char mods) {
  switch(event) {
    case EVENT_PRESS:
      switch(key) {
        case MOUSE_LEFT:
          mouse_pressed(LEFT);
          break;
        case MOUSE_RIGHT:
          mouse_pressed(RIGHT);
          break;
        case MOUSE_MIDDLE:
          mouse_pressed(MIDDLE);
          break;
      }
      break;
    case EVENT_RELEASE:
      switch(key) {
        case MOUSE_LEFT:
          mouse_released(LEFT);
          break;
        case MOUSE_RIGHT:
          mouse_released(RIGHT);
          break;
        case MOUSE_MIDDLE:
          mouse_released(MIDDLE);
          break;
      }
      break;
  }
}